

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,
          ConditionalDirectiveExpressionSyntax *args_2,TokenList *args_3)

{
  Token directive;
  ConditionalBranchDirectiveSyntax *pCVar1;
  ConditionalDirectiveExpressionSyntax *in_RCX;
  undefined8 in_RDX;
  SyntaxKind kind;
  ConditionalBranchDirectiveSyntax *in_RSI;
  undefined8 in_RDI;
  TokenList *in_R8;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  kind = (SyntaxKind)((ulong)in_RDX >> 0x20);
  pCVar1 = (ConditionalBranchDirectiveSyntax *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  directive.info = unaff_retaddr;
  directive.kind = (short)in_RDI;
  directive._2_1_ = (char)((ulong)in_RDI >> 0x10);
  directive.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  directive.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::ConditionalBranchDirectiveSyntax::ConditionalBranchDirectiveSyntax
            (in_RSI,kind,directive,in_RCX,in_R8);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }